

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O1

int lws_add_http2_header_by_name(lws *wsi,uchar *name,uchar *value,int length,uchar **p,uchar *end)

{
  uchar *puVar1;
  byte *pbVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  long lVar10;
  
  uVar4 = 0;
  _lws_log(0x40,"%s: %p  %s:%s (len %d)\n","lws_add_http2_header_by_name",*p,name,value,length);
  sVar6 = strlen((char *)name);
  iVar5 = (int)sVar6;
  if (iVar5 != 0) {
    uVar4 = iVar5 - (uint)(name[iVar5 + -1] == ':');
  }
  if (((wsi->field_0x2dc & 2) != 0) &&
     (iVar5 = strncmp((char *)name,"transfer-encoding",(long)(int)uVar4), iVar5 == 0)) {
    _lws_log(0x40,"rejecting %s\n",name);
    return 0;
  }
  puVar1 = *p;
  iVar5 = 1;
  if ((long)(int)(length + uVar4 + 8) <= (long)end - (long)puVar1) {
    *p = puVar1 + 1;
    *puVar1 = '\0';
    uVar7 = (ulong)(int)uVar4;
    uVar8 = 0x7f;
    if (uVar7 < 0x7f) {
      uVar8 = uVar7;
    }
    puVar1 = *p;
    *p = puVar1 + 1;
    *puVar1 = (uchar)uVar8;
    if (0x7e < uVar4) {
      uVar8 = uVar7 - 0x7f;
      do {
        bVar9 = (byte)uVar8 | 0x80;
        if (uVar8 < 0x80) {
          bVar9 = (byte)uVar8;
        }
        pbVar2 = *p;
        *p = pbVar2 + 1;
        *pbVar2 = bVar9;
        if (end <= *p) {
          return 1;
        }
        bVar3 = 0x7f < uVar8;
        uVar8 = uVar8 >> 7;
      } while (bVar3);
    }
    if (uVar4 != 0) {
      lVar10 = 0;
      do {
        iVar5 = tolower((uint)name[lVar10]);
        puVar1 = *p;
        *p = puVar1 + 1;
        *puVar1 = (uchar)iVar5;
        lVar10 = lVar10 + 1;
      } while (uVar4 != (uint)lVar10);
    }
    uVar7 = (ulong)length;
    uVar8 = 0x7f;
    if (uVar7 < 0x7f) {
      uVar8 = uVar7;
    }
    puVar1 = *p;
    *p = puVar1 + 1;
    *puVar1 = (uchar)uVar8;
    if (0x7e < (uint)length) {
      uVar8 = uVar7 - 0x7f;
      do {
        bVar9 = (byte)uVar8 | 0x80;
        if (uVar8 < 0x80) {
          bVar9 = (byte)uVar8;
        }
        pbVar2 = *p;
        *p = pbVar2 + 1;
        *pbVar2 = bVar9;
        if (end <= *p) {
          return 1;
        }
        bVar3 = 0x7f < uVar8;
        uVar8 = uVar8 >> 7;
      } while (bVar3);
    }
    memcpy(*p,value,uVar7);
    *p = *p + uVar7;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int lws_add_http2_header_by_name(struct lws *wsi, const unsigned char *name,
				 const unsigned char *value, int length,
				 unsigned char **p, unsigned char *end)
{
	int len;

	lwsl_header("%s: %p  %s:%s (len %d)\n", __func__, *p, name, value,
					length);

	len = (int)strlen((char *)name);
	if (len)
		if (name[len - 1] == ':')
			len--;

	if (wsi->mux_substream && !strncmp((const char *)name,
					     "transfer-encoding", len)) {
		lwsl_header("rejecting %s\n", name);

		return 0;
	}

	if (end - *p < len + length + 8)
		return 1;

	*((*p)++) = 0; /* literal hdr, literal name,  */

	*((*p)++) = 0 | lws_h2_num_start(7, len); /* non-HUF */
	if (lws_h2_num(7, len, p, end))
		return 1;

	/* upper-case header names are verboten in h2, but OK on h1, so
	 * they're not illegal per se.  Silently convert them for h2... */

	while(len--)
		*((*p)++) = tolower((int)*name++);

	*((*p)++) = 0 | lws_h2_num_start(7, length); /* non-HUF */
	if (lws_h2_num(7, length, p, end))
		return 1;

	memcpy(*p, value, length);
	*p += length;

	return 0;
}